

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ints.cpp
# Opt level: O2

void test_limits<bool>(void)

{
  ostream *poVar1;
  bool *in_R8;
  bool local_1d2;
  char local_1d1;
  string actual;
  string expected;
  stringstream str;
  undefined1 local_180 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(local_180,0));
  poVar1 = std::operator<<(poVar1," ");
  std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__cxx11::stringbuf::str();
  local_1d1 = '\0';
  local_1d2 = true;
  format::string<std::__cxx11::string,char_const[8],bool,bool>
            (&actual,(format *)"{0} {1}",(char (*) [8])&local_1d1,&local_1d2,in_R8);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&expected);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,(string *)&actual);
  std::operator<<(poVar1,"\n");
  expect_eq<std::__cxx11::string,std::__cxx11::string>
            (&expected,&actual,
             "/workspace/llm4binary/github/license_all_cmakelists_25/dacap[P]format/tests/ints.cpp",
             0x1b);
  std::__cxx11::string::~string((string *)&actual);
  std::__cxx11::string::~string((string *)&expected);
  std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  return;
}

Assistant:

void test_limits() {
  std::stringstream str;
  str << std::numeric_limits<T>::min() << " "
      << std::numeric_limits<T>::max();

  std::string expected = str.str();
  std::string actual =
    format::string("{0} {1}",
                   std::numeric_limits<T>::min(),
                   std::numeric_limits<T>::max());

  std::cout << expected << "\n"
            << actual << "\n";

  EXPECT_EQ(expected, actual);
}